

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayoutState::saveState(QMainWindowLayoutState *this,QDataStream *stream)

{
  QWidget *this_00;
  QDockWidgetGroupWindow **ppQVar1;
  bool bVar2;
  QLayout *pQVar3;
  QDataStream *pQVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QDockWidgetGroupWindow_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDockAreaLayout::saveState(&this->dockAreaLayout,stream);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
  QObject::findChildren<QDockWidgetGroupWindow*>
            ((QList<QDockWidgetGroupWindow_*> *)&local_58,(QObject *)this->mainWindow,
             (FindChildOptions)0x0);
  ppQVar1 = local_58.ptr;
  lVar6 = local_58.size << 3;
  for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 8) {
    this_00 = *(QWidget **)((long)ppQVar1 + lVar5);
    pQVar3 = QWidget::layout(this_00);
    bVar2 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)&pQVar3[4].super_QLayoutItem);
    if (!bVar2) {
      pQVar4 = (QDataStream *)QDataStream::operator<<(stream,0xfffffff9);
      ::operator<<(pQVar4,&this_00->data->crect);
      pQVar3 = QWidget::layout(this_00);
      QDockAreaLayoutInfo::saveState((QDockAreaLayoutInfo *)&pQVar3[4].super_QLayoutItem,stream);
    }
  }
  QToolBarAreaLayout::saveState(&this->toolBarAreaLayout,stream);
  QArrayDataPointer<QDockWidgetGroupWindow_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayoutState::saveState(QDataStream &stream) const
{
#if QT_CONFIG(dockwidget)
    dockAreaLayout.saveState(stream);
#if QT_CONFIG(tabbar)
    const QList<QDockWidgetGroupWindow *> floatingTabs =
        mainWindow->findChildren<QDockWidgetGroupWindow *>(Qt::FindDirectChildrenOnly);

    for (QDockWidgetGroupWindow *floating : floatingTabs) {
        if (floating->layoutInfo()->isEmpty())
            continue;
        stream << uchar(QDockAreaLayout::FloatingDockWidgetTabMarker) << floating->geometry();
        floating->layoutInfo()->saveState(stream);
    }
#endif
#endif
#if QT_CONFIG(toolbar)
    toolBarAreaLayout.saveState(stream);
#endif
}